

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O0

void deqp::gles3::Functional::evalTexture2DArrayBias(ShaderEvalContext *c,TexLookupParams *p)

{
  float s;
  float t;
  float r;
  float fVar1;
  float *pfVar2;
  Vector<float,_4> local_48;
  Vector<float,_4> local_38;
  undefined8 local_28;
  undefined8 local_20;
  TexLookupParams *local_18;
  TexLookupParams *p_local;
  ShaderEvalContext *c_local;
  
  local_18 = p;
  p_local = (TexLookupParams *)c;
  pfVar2 = tcu::Vector<float,_4>::x(c->in);
  s = *pfVar2;
  pfVar2 = tcu::Vector<float,_4>::y((Vector<float,_4> *)(p_local + 1));
  t = *pfVar2;
  pfVar2 = tcu::Vector<float,_4>::z((Vector<float,_4> *)(p_local + 1));
  r = *pfVar2;
  fVar1 = local_18->lod;
  pfVar2 = tcu::Vector<float,_4>::x(&p_local[1].scale);
  texture2DArray((Functional *)&local_48,c,s,t,r,fVar1 + *pfVar2);
  tcu::operator*((tcu *)&local_38,&local_48,&local_18->scale);
  tcu::operator+((tcu *)&local_28,&local_38,&local_18->bias);
  *(undefined8 *)p_local[10].scale.m_data = local_28;
  *(undefined8 *)(p_local[10].scale.m_data + 2) = local_20;
  return;
}

Assistant:

static void		evalTexture2DArrayBias	(gls::ShaderEvalContext& c, const TexLookupParams& p)	{ c.color = texture2DArray(c, c.in[0].x(), c.in[0].y(), c.in[0].z(), p.lod+c.in[1].x())*p.scale + p.bias; }